

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

Cord __thiscall google::protobuf::io::CordOutputStream::Consume(CordOutputStream *this)

{
  Cord *this_00;
  cordz_info_t cVar1;
  undefined8 extraout_RDX;
  long in_RSI;
  Cord CVar2;
  anon_union_16_2_b9f6da03_for_Rep_1 local_28;
  
  this_00 = (Cord *)(in_RSI + 8);
  local_28.long_rep.rep = (CordRepFlat *)*(undefined8 *)(in_RSI + 0x28);
  local_28.long_rep.padding = (void *)*(undefined8 *)(in_RSI + 0x30);
  *(undefined1 *)(in_RSI + 0x28) = 1;
  absl::lts_20240722::Cord::Append(this_00,(CordBuffer *)&local_28.long_rep);
  absl::lts_20240722::CordBuffer::~CordBuffer((CordBuffer *)&local_28.long_rep);
  *(undefined4 *)(in_RSI + 0x20) = 0;
  cVar1 = *(cordz_info_t *)(in_RSI + 0x10);
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)(this_00->contents_).data_.rep_.field_0.as_tree.cordz_info;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info = cVar1;
  (this_00->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  *(undefined8 *)(in_RSI + 0x10) = 0;
  CVar2.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)extraout_RDX;
  CVar2.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar2.contents_.data_.rep_.field_0;
}

Assistant:

absl::Cord CordOutputStream::Consume() {
  cord_.Append(std::move(buffer_));
  state_ = State::kEmpty;
  return std::move(cord_);
}